

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

BYTE * __thiscall FBehavior::FindChunk(FBehavior *this,DWORD id)

{
  bool bVar1;
  DWORD *local_28;
  BYTE *chunk;
  DWORD id_local;
  FBehavior *this_local;
  
  local_28 = (DWORD *)this->Chunks;
  while( true ) {
    bVar1 = false;
    if (local_28 != (DWORD *)0x0) {
      bVar1 = local_28 < this->Data + this->DataSize;
    }
    if (!bVar1) break;
    if (*local_28 == id) {
      return (BYTE *)local_28;
    }
    local_28 = (DWORD *)((long)local_28 + (ulong)(local_28[1] + 8));
  }
  return (BYTE *)0x0;
}

Assistant:

BYTE *FBehavior::FindChunk (DWORD id) const
{
	BYTE *chunk = Chunks;

	while (chunk != NULL && chunk < Data + DataSize)
	{
		if (((DWORD *)chunk)[0] == id)
		{
			return chunk;
		}
		chunk += LittleLong(((DWORD *)chunk)[1]) + 8;
	}
	return NULL;
}